

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O3

int str_gsub(lua_State *L)

{
  char cVar1;
  lua_State *L_00;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *s;
  char *pcVar5;
  lua_Integer lVar6;
  byte *e;
  char *pcVar7;
  ulong uVar8;
  size_t l;
  size_t srcl;
  MatchState ms;
  luaL_Buffer b;
  ulong local_2288;
  lua_State *local_2280;
  char *local_2278;
  size_t local_2270;
  MatchState local_2268;
  luaL_Buffer local_2048;
  
  s = (byte *)luaL_checklstring(L,1,&local_2270);
  pcVar5 = luaL_checklstring(L,2,(size_t *)0x0);
  iVar3 = lua_type(L,3);
  lVar6 = luaL_optinteger(L,4,local_2270 + 1);
  cVar1 = *pcVar5;
  if (3 < iVar3 - 3U) {
    luaL_argerror(L,3,"string/function/table expected");
  }
  pcVar5 = pcVar5 + (cVar1 == '^');
  luaL_buffinit(L,&local_2048);
  local_2268.src_end = (char *)(s + local_2270);
  iVar3 = 0;
  local_2280 = L;
  local_2278 = pcVar5;
  local_2268.src_init = (char *)s;
  local_2268.L = L;
  do {
    e = s;
    if ((int)lVar6 <= iVar3) break;
    local_2268.level = 0;
    e = (byte *)match(&local_2268,(char *)s,pcVar5);
    L_00 = local_2268.L;
    if (e == (byte *)0x0) {
LAB_001137ef:
      e = s;
      if (local_2268.src_end <= s) break;
      if (&stack0xffffffffffffffd0 <= local_2048.p) {
        luaL_prepbuffer(&local_2048);
      }
      e = s + 1;
      *local_2048.p = *s;
      local_2048.p = (char *)((byte *)local_2048.p + 1);
    }
    else {
      iVar4 = lua_type(local_2268.L,3);
      if (iVar4 - 3U < 2) {
        pcVar7 = lua_tolstring(L_00,3,&local_2288);
        pcVar5 = local_2278;
        if (local_2288 != 0) {
          uVar8 = 0;
          do {
            bVar2 = pcVar7[uVar8];
            if (bVar2 == 0x25) {
              bVar2 = pcVar7[uVar8 + 1];
              uVar8 = uVar8 + 1;
              if (bVar2 - 0x30 < 10) {
                if (bVar2 == 0x30) {
                  luaL_addlstring(&local_2048,(char *)s,(long)e - (long)s);
                }
                else {
                  push_onecapture(&local_2268,(char)bVar2 + -0x31,(char *)s,(char *)e);
                  luaL_addvalue(&local_2048);
                }
              }
              else {
                if (&stack0xffffffffffffffd0 <= local_2048.p) {
                  luaL_prepbuffer(&local_2048);
                  bVar2 = pcVar7[uVar8];
                }
                *local_2048.p = bVar2;
                local_2048.p = (char *)((byte *)local_2048.p + 1);
              }
            }
            else {
              if (&stack0xffffffffffffffd0 <= local_2048.p) {
                luaL_prepbuffer(&local_2048);
                bVar2 = pcVar7[uVar8];
              }
              *local_2048.p = bVar2;
              local_2048.p = (char *)((byte *)local_2048.p + 1);
            }
            uVar8 = uVar8 + 1;
            pcVar5 = local_2278;
          } while (uVar8 < local_2288);
        }
      }
      else {
        if (iVar4 == 5) {
          push_onecapture(&local_2268,0,(char *)s,(char *)e);
          lua_gettable(L_00,3);
        }
        else if (iVar4 == 6) {
          lua_pushvalue(L_00,3);
          iVar4 = push_captures(&local_2268,(char *)s,(char *)e);
          lua_call(L_00,iVar4,1);
        }
        iVar4 = lua_toboolean(L_00,-1);
        if (iVar4 == 0) {
          lua_settop(L_00,-2);
          lua_pushlstring(L_00,(char *)s,(long)e - (long)s);
        }
        else {
          iVar4 = lua_isstring(L_00,-1);
          if (iVar4 == 0) {
            iVar4 = lua_type(L_00,-1);
            pcVar7 = lua_typename(L_00,iVar4);
            luaL_error(L_00,"invalid replacement value (a %s)",pcVar7);
          }
        }
        luaL_addvalue(&local_2048);
      }
      iVar3 = iVar3 + 1;
      if (e <= s) goto LAB_001137ef;
    }
    s = e;
  } while (cVar1 != '^');
  luaL_addlstring(&local_2048,(char *)e,(long)local_2268.src_end - (long)e);
  luaL_pushresult(&local_2048);
  lua_pushinteger(local_2280,(long)iVar3);
  return 2;
}

Assistant:

static int str_gsub (lua_State *L) {
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, srcl+1);
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  luaL_argcheck(L, tr == LUA_TNUMBER || tr == LUA_TSTRING ||
                   tr == LUA_TFUNCTION || tr == LUA_TTABLE, 3,
                      "string/function/table expected");
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else break;
    if (anchor) break;
  }
  luaL_addlstring(&b, src, ms.src_end-src);
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}